

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O2

void __thiscall IniProcessing::setValue(IniProcessing *this,char *key,short value)

{
  undefined6 in_register_00000012;
  string sStack_38;
  
  std::__cxx11::to_string(&sStack_38,(int)CONCAT62(in_register_00000012,value));
  writeIniParam(this,key,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void IniProcessing::setValue(const char *key, short value)
{
    writeIniParam(key, std::to_string(value));
}